

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O0

Info * __thiscall
SpecificStrategy::extractInfo(Info *__return_storage_ptr__,SpecificStrategy *this,CFG *cfg)

{
  CfgNode *this_00;
  bool bVar1;
  Type TVar2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar3;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *psVar4;
  reference ppCVar5;
  BlockData *this_01;
  list<Instruction_*,_std::allocator<Instruction_*>_> *this_02;
  reference ppIVar6;
  Addr from;
  Addr to;
  Edge local_240;
  Instruction *local_228;
  Instruction *instr;
  const_iterator __end2;
  const_iterator __begin2;
  list<Instruction_*,_std::allocator<Instruction_*>_> *__range2;
  Instruction *previous;
  BlockData *block;
  CfgNode *node;
  iterator __end1;
  iterator __begin1;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> *__range1;
  set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> local_190;
  undefined1 local_150 [8];
  CfgData data;
  CFG *cfg_local;
  SpecificStrategy *this_local;
  Info *info;
  
  data.m_indirects._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  Info::Info(__return_storage_ptr__);
  CfgData::CfgData((CfgData *)local_150,cfg);
  psVar3 = CfgData::instrs((CfgData *)local_150);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
            (&__return_storage_ptr__->instrs,psVar3);
  psVar4 = CfgData::blocks((CfgData *)local_150);
  std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::operator=
            (&(__return_storage_ptr__->blocks).perfect,psVar4);
  psVar3 = CfgData::phantoms((CfgData *)local_150);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
            (&__return_storage_ptr__->phantoms,psVar3);
  CfgData::edges(&local_190,(CfgData *)local_150);
  std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::operator=
            (&(__return_storage_ptr__->edges).external.perfect,&local_190);
  std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::~set
            (&local_190);
  CfgData::calls((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
                 &__range1,(CfgData *)local_150);
  std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::operator=
            (&__return_storage_ptr__->calls,
             (set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             &__range1);
  std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::~set
            ((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             &__range1);
  psVar3 = CfgData::indirects((CfgData *)local_150);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
            (&__return_storage_ptr__->indirects,psVar3);
  CFG::nodes_abi_cxx11_((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&__begin1,cfg);
  __end1 = std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::begin
                     ((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&__begin1);
  node = (CfgNode *)
         std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::end
                   ((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&__begin1);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&node), bVar1) {
    ppCVar5 = std::_List_iterator<CfgNode_*>::operator*(&__end1);
    this_00 = *ppCVar5;
    TVar2 = CfgNode::type(this_00);
    if (TVar2 == CFG_BLOCK) {
      this_01 = (BlockData *)CfgNode::data(this_00);
      __range2 = (list<Instruction_*,_std::allocator<Instruction_*>_> *)0x0;
      this_02 = CfgNode::BlockData::instructions_abi_cxx11_(this_01);
      __end2 = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::begin(this_02);
      instr = (Instruction *)
              std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::end(this_02);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&instr), bVar1) {
        ppIVar6 = std::_List_const_iterator<Instruction_*>::operator*(&__end2);
        local_228 = *ppIVar6;
        if (__range2 != (list<Instruction_*,_std::allocator<Instruction_*>_> *)0x0) {
          from = Instruction::addr((Instruction *)__range2);
          to = Instruction::addr(local_228);
          CfgData::Edge::Edge(&local_240,from,to);
          std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::insert
                    ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *
                     )&__return_storage_ptr__->edges,&local_240);
          CfgData::Edge::~Edge(&local_240);
        }
        __range2 = (list<Instruction_*,_std::allocator<Instruction_*>_> *)local_228;
        std::_List_const_iterator<Instruction_*>::operator++(&__end2);
      }
    }
    std::_List_iterator<CfgNode_*>::operator++(&__end1);
  }
  std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::~list
            ((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&__begin1);
  data.m_indirects._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  CfgData::~CfgData((CfgData *)local_150);
  if ((data.m_indirects._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    Info::~Info(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SpecificStrategy::Info SpecificStrategy::extractInfo(CFG* cfg) {
	SpecificStrategy::Info info;

	CfgData data(cfg);
	info.instrs = data.instrs();
	info.blocks.perfect = data.blocks();
	info.phantoms = data.phantoms();
	info.edges.external.perfect = data.edges();
	info.calls = data.calls();
	info.indirects = data.indirects();

	for (CfgNode* node : cfg->nodes()) {
		if (node->type() != CfgNode::CFG_BLOCK)
			continue;

		CfgNode::BlockData* block = static_cast<CfgNode::BlockData*>(node->data());
		Instruction* previous = 0;
		for (Instruction* instr : block->instructions()) {
			if (previous != 0)
				info.edges.internal.perfect.insert(CfgData::Edge(previous->addr(), instr->addr()));

			previous = instr;
		}
	}

	return info;
}